

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O0

void __thiscall
slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator::setRoot
          (const_iterator *this,uint32_t offset)

{
  bool bVar1;
  uint32_t in_ESI;
  BranchNode<unsigned_long,_8U,_true> *in_RDI;
  Path *unaff_retaddr;
  uint32_t in_stack_fffffffffffffff0;
  
  bVar1 = isFlat((const_iterator *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  if (bVar1) {
    IntervalMapDetails::Path::
    setRoot<slang::IntervalMapDetails::LeafNode<unsigned_long,slang::ast::ValueDriver_const*,8u,true>>
              (unaff_retaddr,
               (LeafNode<unsigned_long,_const_slang::ast::ValueDriver_*,_8U,_true> *)in_RDI,in_ESI,
               in_stack_fffffffffffffff0);
  }
  else {
    IntervalMapDetails::Path::setRoot<slang::IntervalMapDetails::BranchNode<unsigned_long,8u,true>>
              (unaff_retaddr,in_RDI,in_ESI,in_stack_fffffffffffffff0);
  }
  return;
}

Assistant:

void setRoot(uint32_t offset) {
        if (isFlat())
            path.setRoot(&map->rootLeaf, map->rootSize, offset);
        else
            path.setRoot(&map->rootBranch, map->rootSize, offset);
    }